

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O0

_Bool borg_one_step_wearing_best(int skip)

{
  borg_item_conflict *pbVar1;
  _Bool _Var2;
  uint16_t uVar3;
  uint uVar4;
  int local_24;
  int skipping;
  int i;
  int slot;
  int item_num;
  borg_item_conflict *item;
  int skip_local;
  
  i = 0;
  if (borg.goal.best_item == (borg_best *)0x0) {
    return false;
  }
  while( true ) {
    while (((borg.goal.best_item[i].tval == '\0' && (borg.goal.best_item[i].pval == 0)) &&
           (borg.goal.best_item[i].sval == '\0'))) {
      i = i + 1;
      if ((int)(uint)z_info->equip_slots_max <= i) {
        borg_clear_best();
        if (skip == 0) {
          borg.goal.do_best = false;
        }
        return false;
      }
    }
    if (skip == 0) break;
    i = i + 1;
  }
  uVar3 = borg_best_stuff_order(i);
  uVar4 = (uint)uVar3;
  if ((borg.goal.best_item[i].home & 1U) == 0) {
    if (borg_items[(int)uVar4].iqty != '\0') {
      _Var2 = borg_inventory_full();
      if (!_Var2) {
        borg_keypress(0x74);
        borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                           [(int)(uVar4 - z_info->pack_size)]);
        return true;
      }
      _Var2 = borg_one_step_wearing_best(1);
      return _Var2;
    }
    for (local_24 = 0; local_24 < (int)(z_info->pack_size + 0xc); local_24 = local_24 + 1) {
      if (((borg_items[local_24].pval == borg.goal.best_item[i].pval) &&
          (borg_items[local_24].tval == borg.goal.best_item[i].tval)) &&
         (borg_items[local_24].sval == borg.goal.best_item[i].sval)) {
        borg_keypress(0x77);
        borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[local_24]);
        borg.goal.best_item[i].home = false;
        borg.goal.best_item[i].tval = '\0';
        borg.goal.best_item[i].pval = 0;
        borg.goal.best_item[i].sval = '\0';
        return true;
      }
    }
    borg_oops("unable to find item in inventory");
  }
  else {
    if (borg_items[(int)uVar4].iqty != '\0') {
      _Var2 = borg_home_full();
      if (!_Var2) {
        borg_keypress(100);
        borg_keypress(0x2f);
        borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                           [(int)(uVar4 - z_info->pack_size)]);
        return true;
      }
      _Var2 = borg_one_step_wearing_best(1);
      return _Var2;
    }
    _Var2 = borg_inventory_full();
    if (_Var2) {
      _Var2 = borg_one_step_wearing_best(1);
      return _Var2;
    }
    for (local_24 = 0; local_24 < (int)(uint)z_info->store_inven_max; local_24 = local_24 + 1) {
      pbVar1 = borg_shops[7].ware;
      if (((pbVar1[local_24].pval == borg.goal.best_item[i].pval) &&
          (pbVar1[local_24].tval == borg.goal.best_item[i].tval)) &&
         (pbVar1[local_24].sval == borg.goal.best_item[i].sval)) {
        borg_keypress((int)SHOP_MENU_ITEMS[local_24]);
        borg_keypress(0x70);
        if (1 < pbVar1[local_24].iqty) {
          borg_keypress(0x9c);
        }
        borg.goal.best_item[i].home = false;
        return true;
      }
    }
    borg_oops("unable to find item in home");
  }
  return false;
}

Assistant:

static bool borg_one_step_wearing_best(int skip)
{
    borg_item *item;
    int        item_num = 0;
    int        slot;
    int        i;

    if (!borg.goal.best_item)
        return false;

    /* find a change */
    while (true) {
        /* skip some if there are issues with full inventory */
        int skipping = skip;
        if (borg.goal.best_item[item_num].tval
            || borg.goal.best_item[item_num].pval
            || borg.goal.best_item[item_num].sval) {
            if (skipping) {
                item_num++;
                skipping--;
                continue;
            }

            break;
        }

        item_num++;
        if (item_num >= z_info->equip_slots_max) {
            borg_clear_best();

            /* If we aren't skipping we have done our best optimization.  */
            /* if we are skipping and got to the end, we probably need */
            /*  to start over */
            if (!skip) {
                borg.goal.do_best = false;
            }

            return false;
        }
    }

    /* Extract the slot */
    slot = borg_best_stuff_order(item_num);

    /* if the item is a home item to be worn, */
    /*  * drop any item you already have in the slot */
    /*  * if the slot is empty, pick up the item and mark */
    /*    as not in the home */
    /* if the item is not a home item to be worn, */
    /*      it is an inventory item.  */
    /*  * take off any item you already have in the slot */
    /*  * if the slot is empty, wear the item */
    /* NOTE that items need to be found again because they could have */
    /*   moved slots since other objects are being taken off and dropped */
    /*   into inventory and the home*/
    if (borg.goal.best_item[item_num].home) {
        /* if wearing an item in that slot, drop it */
        if (borg_items[slot].iqty) {

            /* if we can't drop an item into the home try the next change */
            if (borg_home_full())
                return borg_one_step_wearing_best(skip+1);


            borg_keypress('d');
            borg_keypress('/');
            borg_keypress(all_letters_nohjkl[slot - INVEN_WIELD]);
            return true;
        }

        /* if we can't get an item from the home, try the next change */
        if (borg_inventory_full())
            return borg_one_step_wearing_best(skip + 1);

        for (i = 0; i < z_info->store_inven_max; i++) {
            item = &borg_shops[BORG_HOME].ware[i];

            if (item->pval != borg.goal.best_item[item_num].pval
                || item->tval != borg.goal.best_item[item_num].tval
                || item->sval != borg.goal.best_item[item_num].sval)
                continue;

            /* "Buy" the desired item from the home */
            borg_keypress(SHOP_MENU_ITEMS[i]);
            borg_keypress('p');
            if (item->iqty > 1)
                borg_keypress(KC_ENTER);


            borg.goal.best_item[item_num].home = false;
            return true;
        }
        borg_oops("unable to find item in home");
    } else {
        /* if wearing an item in that slot, take it off */
        if (borg_items[slot].iqty) {
            /* take off an item because there is no room, try next */
            if (borg_inventory_full())
                return borg_one_step_wearing_best(skip + 1);

            borg_keypress('t');
            borg_keypress(all_letters_nohjkl[slot - INVEN_WIELD]);
            return true;
        }
        for (i = 0; i < INVEN_TOTAL; i++) {
            item = &borg_items[i];

            if (item->pval != borg.goal.best_item[item_num].pval
                || item->tval != borg.goal.best_item[item_num].tval
                || item->sval != borg.goal.best_item[item_num].sval)
                continue;
            borg_keypress('w');
            borg_keypress(all_letters_nohjkl[i]);

            borg.goal.best_item[item_num].home = false;
            borg.goal.best_item[item_num].tval = 0;
            borg.goal.best_item[item_num].pval = 0;
            borg.goal.best_item[item_num].sval = 0;
            return true;
        }
        borg_oops("unable to find item in inventory");
    }

    return false;
}